

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O2

void * __thiscall
SbrkSysAllocator::Alloc(SbrkSysAllocator *this,size_t size,size_t *actual_size,size_t alignment)

{
  ulong uVar1;
  void *pvVar2;
  void *pvVar3;
  long __delta;
  ulong uVar4;
  
  if ((FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_skip_sbrk == '\0')
     && (-1 < (long)(size + alignment))) {
    uVar4 = (size + alignment) - 1;
    uVar4 = uVar4 - uVar4 % alignment;
    if (actual_size != (size_t *)0x0) {
      *actual_size = uVar4;
    }
    pvVar2 = sbrk(0);
    if (CARRY8((ulong)pvVar2,uVar4)) {
      return (void *)0x0;
    }
    pvVar2 = sbrk(uVar4);
    if (pvVar2 != (void *)0xffffffffffffffff) {
      uVar1 = alignment - 1;
      if ((uVar1 & (ulong)pvVar2) == 0) {
        return pvVar2;
      }
      __delta = alignment - (uVar1 & (ulong)pvVar2);
      pvVar3 = sbrk(__delta);
      if ((void *)(uVar4 + (long)pvVar2) == pvVar3) {
        return (void *)((long)pvVar2 + __delta);
      }
      pvVar2 = sbrk(uVar4 + uVar1);
      if (pvVar2 != (void *)0xffffffffffffffff) {
        if ((uVar1 & (ulong)pvVar2) != 0) {
          return (void *)((long)pvVar2 + (alignment - (uVar1 & (ulong)pvVar2)));
        }
        return pvVar2;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* SbrkSysAllocator::Alloc(size_t size, size_t *actual_size,
                              size_t alignment) {
#if !defined(HAVE_SBRK) || defined(__UCLIBC__)
  return nullptr;
#else
  // Check if we should use sbrk allocation.
  // FLAGS_malloc_skip_sbrk starts out as false (its uninitialized
  // state) and eventually gets initialized to the specified value.  Note
  // that this code runs for a while before the flags are initialized.
  // That means that even if this flag is set to true, some (initial)
  // memory will be allocated with sbrk before the flag takes effect.
  if (FLAGS_malloc_skip_sbrk) {
    return nullptr;
  }

  // sbrk will release memory if passed a negative number, so we do
  // a strict check here
  if (static_cast<ptrdiff_t>(size + alignment) < 0) return nullptr;

  // This doesn't overflow because TCMalloc_SystemAlloc has already
  // tested for overflow at the alignment boundary.
  size = ((size + alignment - 1) / alignment) * alignment;

  // "actual_size" indicates that the bytes from the returned pointer
  // p up to and including (p + actual_size - 1) have been allocated.
  if (actual_size) {
    *actual_size = size;
  }

  // Check that we we're not asking for so much more memory that we'd
  // wrap around the end of the virtual address space.  (This seems
  // like something sbrk() should check for us, and indeed opensolaris
  // does, but glibc does not:
  //    http://src.opensolaris.org/source/xref/onnv/onnv-gate/usr/src/lib/libc/port/sys/sbrk.c?a=true
  //    http://sourceware.org/cgi-bin/cvsweb.cgi/~checkout~/libc/misc/sbrk.c?rev=1.1.2.1&content-type=text/plain&cvsroot=glibc
  // Without this check, sbrk may succeed when it ought to fail.)
  if (reinterpret_cast<intptr_t>(sbrk(0)) + size < size) {
    return nullptr;
  }

  void* result = sbrk(size);
  if (result == reinterpret_cast<void*>(-1)) {
    return nullptr;
  }

  // Is it aligned?
  uintptr_t ptr = reinterpret_cast<uintptr_t>(result);
  if ((ptr & (alignment-1)) == 0)  return result;

  // Try to get more memory for alignment
  size_t extra = alignment - (ptr & (alignment-1));
  void* r2 = sbrk(extra);
  if (reinterpret_cast<uintptr_t>(r2) == (ptr + size)) {
    // Contiguous with previous result
    return reinterpret_cast<void*>(ptr + extra);
  }

  // Give up and ask for "size + alignment - 1" bytes so
  // that we can find an aligned region within it.
  result = sbrk(size + alignment - 1);
  if (result == reinterpret_cast<void*>(-1)) {
    return nullptr;
  }
  ptr = reinterpret_cast<uintptr_t>(result);
  if ((ptr & (alignment-1)) != 0) {
    ptr += alignment - (ptr & (alignment-1));
  }
  return reinterpret_cast<void*>(ptr);
#endif  // HAVE_SBRK
}